

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ExceptionOr<kj::Promise<kj::AsyncCapabilityStream::ReadResult>_>::~ExceptionOr
          (ExceptionOr<kj::Promise<kj::AsyncCapabilityStream::ReadResult>_> *this)

{
  ExceptionOr<kj::Promise<kj::AsyncCapabilityStream::ReadResult>_> *this_local;
  
  Maybe<kj::Promise<kj::AsyncCapabilityStream::ReadResult>_>::~Maybe(&this->value);
  ExceptionOrValue::~ExceptionOrValue(&this->super_ExceptionOrValue);
  return;
}

Assistant:

ExceptionOr() = default;